

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O2

void ScaleAddRow_SSE2(uint8_t *src_ptr,uint16_t *dst_ptr,int src_width)

{
  bool bVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  do {
    auVar12 = *(undefined1 (*) [16])src_ptr;
    src_ptr = (uint8_t *)((long)src_ptr + 0x10);
    auVar2[0xd] = 0;
    auVar2._0_13_ = auVar12._0_13_;
    auVar2[0xe] = auVar12[7];
    auVar3[0xc] = auVar12[6];
    auVar3._0_12_ = auVar12._0_12_;
    auVar3._13_2_ = auVar2._13_2_;
    auVar4[0xb] = 0;
    auVar4._0_11_ = auVar12._0_11_;
    auVar4._12_3_ = auVar3._12_3_;
    auVar5[10] = auVar12[5];
    auVar5._0_10_ = auVar12._0_10_;
    auVar5._11_4_ = auVar4._11_4_;
    auVar6[9] = 0;
    auVar6._0_9_ = auVar12._0_9_;
    auVar6._10_5_ = auVar5._10_5_;
    auVar7[8] = auVar12[4];
    auVar7._0_8_ = auVar12._0_8_;
    auVar7._9_6_ = auVar6._9_6_;
    auVar8._7_8_ = 0;
    auVar8._0_7_ = auVar7._8_7_;
    auVar9._1_8_ = SUB158(auVar8 << 0x40,7);
    auVar9[0] = auVar12[3];
    auVar9._9_6_ = 0;
    auVar10._1_10_ = SUB1510(auVar9 << 0x30,5);
    auVar10[0] = auVar12[2];
    auVar10._11_4_ = 0;
    auVar13._3_12_ = SUB1512(auVar10 << 0x20,3);
    auVar13[2] = auVar12[1];
    auVar13[0] = auVar12[0];
    auVar13[1] = 0;
    auVar13[0xf] = 0;
    auVar14[1] = 0;
    auVar14[0] = auVar12[8];
    auVar14[2] = auVar12[9];
    auVar14[3] = 0;
    auVar14[4] = auVar12[10];
    auVar14[5] = 0;
    auVar14[6] = auVar12[0xb];
    auVar14[7] = 0;
    auVar14[8] = auVar12[0xc];
    auVar14[9] = 0;
    auVar14[10] = auVar12[0xd];
    auVar14[0xb] = 0;
    auVar14[0xc] = auVar12[0xe];
    auVar14[0xd] = 0;
    auVar14[0xe] = auVar12[0xf];
    auVar14[0xf] = 0;
    auVar12 = paddusw(*(undefined1 (*) [16])dst_ptr,auVar13);
    auVar13 = paddusw(*(undefined1 (*) [16])((long)dst_ptr + 0x10),auVar14);
    *(undefined1 (*) [16])dst_ptr = auVar12;
    *(undefined1 (*) [16])((long)dst_ptr + 0x10) = auVar13;
    dst_ptr = (uint16_t *)((long)dst_ptr + 0x20);
    iVar11 = src_width + -0x10;
    bVar1 = 0xf < src_width;
    src_width = iVar11;
  } while (iVar11 != 0 && bVar1);
  return;
}

Assistant:

void ScaleAddRow_SSE2(const uint8_t* src_ptr,
                      uint16_t* dst_ptr,
                      int src_width) {
  asm volatile(

      "pxor        %%xmm5,%%xmm5                 \n"

      // 16 pixel loop.
      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm3                   \n"
      "lea         0x10(%0),%0                   \n"  // src_ptr += 16
      "movdqu      (%1),%%xmm0                   \n"
      "movdqu      0x10(%1),%%xmm1               \n"
      "movdqa      %%xmm3,%%xmm2                 \n"
      "punpcklbw   %%xmm5,%%xmm2                 \n"
      "punpckhbw   %%xmm5,%%xmm3                 \n"
      "paddusw     %%xmm2,%%xmm0                 \n"
      "paddusw     %%xmm3,%%xmm1                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "movdqu      %%xmm1,0x10(%1)               \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
      : "+r"(src_ptr),   // %0
        "+r"(dst_ptr),   // %1
        "+r"(src_width)  // %2
      :
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm5");
}